

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

void __thiscall QAccessibleTableCell::columnIndex(QAccessibleTableCell *this)

{
  columnIndex((QAccessibleTableCell *)&this[-1].m_role);
  return;
}

Assistant:

int QAccessibleTableCell::columnIndex() const
{
    if (!isValid())
        return -1;
#if QT_CONFIG(listview)
    if (role() == QAccessible::ListItem) {
        return 0;
    }
#endif
    return m_index.column();
}